

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O3

void webrtc::CovarianceMatrixGenerator::AngledCovarianceMatrix
               (float sound_speed,float angle,size_t frequency_bin,size_t fft_size,
               size_t num_freq_bins,int sample_rate,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,ComplexMatrix<float> *mat)

{
  float fVar1;
  float fVar2;
  Matrix<std::complex<float>_> *this;
  string *psVar3;
  ulong uVar4;
  int line;
  _func_int **num_columns;
  size_t sVar5;
  long lVar6;
  float fVar7;
  ComplexMatrix<float> interf_cov_vector;
  ComplexMatrix<float> interf_cov_vector_transposed;
  uint local_2a4;
  Matrix<std::complex<float>_> *local_2a0;
  Matrix<std::complex<float>_> local_298;
  Matrix<std::complex<float>_> local_220;
  FatalMessage local_1a8;
  
  num_columns = (_func_int **)
                (((long)(geometry->
                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(geometry->
                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  local_298._vptr_Matrix = (_func_int **)(mat->super_Matrix<std::complex<float>_>).num_rows_;
  if ((long)num_columns - (long)local_298._vptr_Matrix != 0) {
    local_1a8._0_8_ = num_columns;
    psVar3 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,(unsigned_long *)&local_298,
                        "geometry.size() == mat->num_rows()");
    if (psVar3 != (string *)0x0) {
      line = 0x47;
      goto LAB_00174109;
    }
    num_columns = (_func_int **)
                  (((long)(geometry->
                          super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(geometry->
                          super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  }
  local_298._vptr_Matrix = (_func_int **)(mat->super_Matrix<std::complex<float>_>).num_columns_;
  local_2a0 = &mat->super_Matrix<std::complex<float>_>;
  local_1a8._0_8_ = num_columns;
  if (num_columns != local_298._vptr_Matrix) {
    psVar3 = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,(unsigned_long *)&local_298,
                        "geometry.size() == mat->num_columns()");
    if (psVar3 != (string *)0x0) {
      line = 0x48;
LAB_00174109:
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
                 ,line,psVar3);
      rtc::FatalMessage::~FatalMessage(&local_1a8);
    }
    num_columns = (_func_int **)
                  (((long)(geometry->
                          super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(geometry->
                          super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  }
  Matrix<std::complex<float>_>::Matrix(&local_298,1,(size_t)num_columns);
  local_298._vptr_Matrix = (_func_int **)&PTR__Matrix_001d1430;
  Matrix<std::complex<float>_>::Matrix
            (&local_220,
             ((long)(geometry->
                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(geometry->
                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,1);
  local_220._vptr_Matrix = (_func_int **)&PTR__Matrix_001d1430;
  PhaseAlignmentMasks(frequency_bin,fft_size,sample_rate,sound_speed,geometry,angle,
                      (ComplexMatrix<float> *)&local_298);
  this = local_2a0;
  local_2a4 = 1;
  local_1a8._0_8_ = local_298.num_rows_;
  if (local_298.num_rows_ != 1) {
    psVar3 = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                       (&local_2a4,(unsigned_long *)&local_1a8,"1u == x.num_rows()");
    if (psVar3 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
                 ,0x1e,psVar3);
      rtc::FatalMessage::~FatalMessage(&local_1a8);
    }
  }
  fVar7 = 0.0;
  if (local_298.num_columns_ != 0) {
    sVar5 = 0;
    do {
      fVar1 = *(float *)&(*local_298.elements_.
                           super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)[sVar5]._M_value;
      fVar2 = *(float *)((long)&(*local_298.elements_.
                                  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start)[sVar5]._M_value + 4);
      fVar7 = fVar7 + fVar1 * fVar1 + fVar2 * fVar2;
      sVar5 = sVar5 + 1;
    } while (local_298.num_columns_ != sVar5);
  }
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  if (local_298.data_.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_298.data_.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      local_298.data_.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_value =
           CONCAT44((float)(local_298.data_.
                            super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_value >> 0x20) *
                    (1.0 / fVar7),
                    (float)local_298.data_.
                           super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_value * (1.0 / fVar7)
                   );
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_298.data_.
                                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_298.data_.
                                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  Matrix<std::complex<float>_>::Transpose(&local_220,&local_298);
  if (local_298.num_columns_ * local_298.num_rows_ != 0) {
    lVar6 = 0;
    do {
      local_298.data_.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_value =
           CONCAT44(*(undefined4 *)
                     ((long)&local_298.data_.
                             super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_value + 4),
                    (int)local_298.data_.
                         super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_value) ^
           0x8000000000000000;
      lVar6 = lVar6 + 1;
    } while (local_298.num_columns_ * local_298.num_rows_ - lVar6 != 0);
  }
  Matrix<std::complex<float>_>::Multiply(this,&local_220,&local_298);
  Matrix<std::complex<float>_>::~Matrix(&local_220);
  Matrix<std::complex<float>_>::~Matrix(&local_298);
  return;
}

Assistant:

void CovarianceMatrixGenerator::AngledCovarianceMatrix(
    float sound_speed,
    float angle,
    size_t frequency_bin,
    size_t fft_size,
    size_t num_freq_bins,
    int sample_rate,
    const std::vector<Point>& geometry,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(geometry.size(), mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  ComplexMatrix<float> interf_cov_vector(1, geometry.size());
  ComplexMatrix<float> interf_cov_vector_transposed(geometry.size(), 1);
  PhaseAlignmentMasks(frequency_bin,
                      fft_size,
                      sample_rate,
                      sound_speed,
                      geometry,
                      angle,
                      &interf_cov_vector);
  interf_cov_vector.Scale(1.f / Norm(interf_cov_vector));
  interf_cov_vector_transposed.Transpose(interf_cov_vector);
  interf_cov_vector.PointwiseConjugate();
  mat->Multiply(interf_cov_vector_transposed, interf_cov_vector);
}